

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_int,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *args,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *args_1,uint *args_2,
               uint *args_3,vector<unsigned_char,_std::allocator<unsigned_char>_> *args_4)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,args);
  Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,args_1);
  ser_writedata32<DataStream>(s,*args_2);
  ser_writedata32<DataStream>(s,*args_3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,args_4);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}